

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

void duckdb::
     PrintfFunction<duckdb::FMTPrintf,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  InternalException *this;
  long lVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t idx;
  string_t sVar12;
  allocator local_c9;
  string dynamic_result;
  idx_t local_a0;
  vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
  string_args;
  vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
  format_args;
  string format_string;
  
  uVar11 = 0;
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  FlatVector::VerifyFlatVector(result);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  TemplatedValidityMask<unsigned_long>::Initialize
            (&(result->validity).super_TemplatedValidityMask<unsigned_long>,args->count);
  do {
    if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= uVar11) {
      local_a0 = 1;
      if (result->vector_type != CONSTANT_VECTOR) {
        local_a0 = args->count;
      }
      pdVar3 = pvVar7->data;
      pdVar4 = result->data;
      for (idx = 0; idx != local_a0; idx = idx + 1) {
        if ((result->vector_type != FLAT_VECTOR) || (bVar6 = FlatVector::IsNull(result,idx), !bVar6)
           ) {
          iVar10 = idx;
          if (pvVar7->vector_type == CONSTANT_VECTOR) {
            iVar10 = 0;
          }
          string_t::GetString_abi_cxx11_(&format_string,(string_t *)(pdVar3 + iVar10 * 0x10));
          format_args.
          super_vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          .
          super__Vector_base<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          format_args.
          super_vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          .
          super__Vector_base<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          format_args.
          super_vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          .
          super__Vector_base<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          string_args.
          super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          string_args.
          super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          string_args.
          super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (uVar11 = 1;
              uVar11 < (ulong)(((long)(args->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x68);
              uVar11 = uVar11 + 1) {
            pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar11);
            iVar10 = idx;
            if (pvVar8->vector_type == CONSTANT_VECTOR) {
              iVar10 = 0;
            }
            switch((pvVar8->type).id_) {
            case BOOLEAN:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 8;
              dynamic_result._M_dataplus._M_p =
                   (pointer)(CONCAT71((int7)((ulong)dynamic_result._M_dataplus._M_p >> 8),
                                      pvVar8->data[iVar10]) & 0xffffffff000000ff);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case TINYINT:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 2;
              dynamic_result._M_dataplus._M_p._0_4_ = (int)(char)pvVar8->data[iVar10];
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case SMALLINT:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 2;
              dynamic_result._M_dataplus._M_p._0_4_ = (int)*(short *)(pvVar8->data + iVar10 * 2);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case INTEGER:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 2;
              dynamic_result._M_dataplus._M_p._0_4_ = *(undefined4 *)(pvVar8->data + iVar10 * 4);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case BIGINT:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 4;
              dynamic_result._M_dataplus._M_p = *(pointer *)(pvVar8->data + iVar10 * 8);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            default:
              this = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&dynamic_result,"Unexpected type for printf format",&local_c9);
              InternalException::InternalException(this,(string *)&dynamic_result);
              __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            case FLOAT:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 10;
              dynamic_result._M_dataplus._M_p._0_4_ = *(undefined4 *)(pvVar8->data + iVar10 * 4);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case DOUBLE:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 0xb;
              dynamic_result._M_dataplus._M_p = *(pointer *)(pvVar8->data + iVar10 * 8);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case VARCHAR:
              pdVar5 = pvVar8->data;
              lVar9 = iVar10 * 0x10;
              dynamic_result._M_string_length = (size_type)*(uint *)(pdVar5 + lVar9);
              if (dynamic_result._M_string_length < 0xd) {
                dynamic_result._M_dataplus._M_p = (pointer)(pdVar5 + lVar9 + 4);
              }
              else {
                dynamic_result._M_dataplus._M_p = *(pointer *)(pdVar5 + lVar9 + 8);
              }
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 0xe;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
              break;
            case UBIGINT:
              dynamic_result.field_2._M_allocated_capacity._0_4_ = 5;
              dynamic_result._M_dataplus._M_p = *(pointer *)(pvVar8->data + iVar10 * 8);
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              emplace_back<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&format_args,
                         (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&dynamic_result);
            }
          }
          FMTPrintf::
          OP<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    (&dynamic_result,(FMTPrintf *)format_string._M_dataplus._M_p,
                     (char *)&format_args,
                     (vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
                      *)0x68);
          sVar12 = StringVector::AddString(result,&dynamic_result);
          *(long *)(pdVar4 + idx * 0x10) = sVar12.value._0_8_;
          *(long *)(pdVar4 + idx * 0x10 + 8) = sVar12.value._8_8_;
          ::std::__cxx11::string::~string((string *)&dynamic_result);
          ::std::
          vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
          ::~vector(&string_args.
                     super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
                   );
          std::
          _Vector_base<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
          ::~_Vector_base((_Vector_base<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
                           *)&format_args);
          ::std::__cxx11::string::~string((string *)&format_string);
        }
      }
      return;
    }
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar11);
    VVar1 = pvVar8->vector_type;
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar11);
    if (VVar1 == CONSTANT_VECTOR) {
      puVar2 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        ConstantVector::SetNull(result,true);
        return;
      }
    }
    else {
      Vector::Flatten(pvVar8,args->count);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar11);
      FlatVector::VerifyFlatVector(pvVar8);
      ValidityMask::Combine(&result->validity,&pvVar8->validity,args->count);
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static void PrintfFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &format_string = args.data[0];
	auto &result_validity = FlatVector::Validity(result);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	result_validity.Initialize(args.size());
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		switch (args.data[i].GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			if (ConstantVector::IsNull(args.data[i])) {
				// constant null! result is always NULL regardless of other input
				result.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result, true);
				return;
			}
			break;
		default:
			// FLAT VECTOR, we can directly OR the nullmask
			args.data[i].Flatten(args.size());
			result.SetVectorType(VectorType::FLAT_VECTOR);
			result_validity.Combine(FlatVector::Validity(args.data[i]), args.size());
			break;
		}
	}
	idx_t count = result.GetVectorType() == VectorType::CONSTANT_VECTOR ? 1 : args.size();

	auto format_data = FlatVector::GetData<string_t>(format_string);
	auto result_data = FlatVector::GetData<string_t>(result);
	for (idx_t idx = 0; idx < count; idx++) {
		if (result.GetVectorType() == VectorType::FLAT_VECTOR && FlatVector::IsNull(result, idx)) {
			// this entry is NULL: skip it
			continue;
		}

		// first fetch the format string
		auto fmt_idx = format_string.GetVectorType() == VectorType::CONSTANT_VECTOR ? 0 : idx;
		auto format_string = format_data[fmt_idx].GetString();

		// now gather all the format arguments
		vector<duckdb_fmt::basic_format_arg<CTX>> format_args;
		vector<unsafe_unique_array<data_t>> string_args;

		for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
			auto &col = args.data[col_idx];
			idx_t arg_idx = col.GetVectorType() == VectorType::CONSTANT_VECTOR ? 0 : idx;
			switch (col.GetType().id()) {
			case LogicalTypeId::BOOLEAN: {
				auto arg_data = FlatVector::GetData<bool>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::TINYINT: {
				auto arg_data = FlatVector::GetData<int8_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::SMALLINT: {
				auto arg_data = FlatVector::GetData<int16_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::INTEGER: {
				auto arg_data = FlatVector::GetData<int32_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::BIGINT: {
				auto arg_data = FlatVector::GetData<int64_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::UBIGINT: {
				auto arg_data = FlatVector::GetData<uint64_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::FLOAT: {
				auto arg_data = FlatVector::GetData<float>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::DOUBLE: {
				auto arg_data = FlatVector::GetData<double>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::VARCHAR: {
				auto arg_data = FlatVector::GetData<string_t>(col);
				auto string_view =
				    duckdb_fmt::basic_string_view<char>(arg_data[arg_idx].GetData(), arg_data[arg_idx].GetSize());
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(string_view));
				break;
			}
			default:
				throw InternalException("Unexpected type for printf format");
			}
		}
		// finally actually perform the format
		string dynamic_result = FORMAT_FUN::template OP<CTX>(format_string.c_str(), format_args);
		result_data[idx] = StringVector::AddString(result, dynamic_result);
	}
}